

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

void phys_page_set_level(PhysPageMap *map,PhysPageEntry *lp,hwaddr *index,uint64_t *nb,uint16_t leaf
                        ,int level)

{
  PhysPageEntry PVar1;
  Node *paPVar2;
  uint32_t uVar3;
  ulong uVar4;
  hwaddr step;
  PhysPageEntry *p;
  int level_local;
  uint16_t leaf_local;
  uint64_t *nb_local;
  hwaddr *index_local;
  PhysPageEntry *lp_local;
  PhysPageMap *map_local;
  
  uVar4 = 1L << ((char)level * '\t' & 0x3fU);
  if ((((uint)*lp & 0x3f) != 0) && ((uint)*lp >> 6 == 0x3ffffff)) {
    uVar3 = phys_map_node_alloc(map,level == 0);
    *lp = (PhysPageEntry)((uint)*lp & 0x3f | uVar3 << 6);
  }
  paPVar2 = map->nodes;
  PVar1 = *lp;
  for (index_local = (hwaddr *)
                     (paPVar2[(uint)PVar1 >> 6] + (*index >> ((char)level * '\t' & 0x3fU) & 0x1ff));
      *nb != 0 && index_local < paPVar2 + (ulong)((uint)PVar1 >> 6) + 1;
      index_local = (hwaddr *)((long)index_local + 4)) {
    if (((*index & uVar4 - 1) == 0) && (uVar4 <= *nb)) {
      *(uint *)index_local = (uint)*index_local & 0xffffffc0;
      *(uint *)index_local = (uint)*index_local & 0x3f | (uint)leaf << 6;
      *index = uVar4 + *index;
      *nb = *nb - uVar4;
    }
    else {
      phys_page_set_level(map,(PhysPageEntry *)index_local,index,nb,leaf,level + -1);
    }
  }
  return;
}

Assistant:

static void phys_page_set_level(PhysPageMap *map, PhysPageEntry *lp,
                                hwaddr *index, uint64_t *nb, uint16_t leaf,
                                int level)
{
    PhysPageEntry *p;
    hwaddr step = (hwaddr)1 << (level * P_L2_BITS);

    if (lp->skip && lp->ptr == PHYS_MAP_NODE_NIL) {
        lp->ptr = phys_map_node_alloc(map, level == 0);
    }
    p = map->nodes[lp->ptr];
    lp = &p[(*index >> (level * P_L2_BITS)) & (P_L2_SIZE - 1)];

    while (*nb && lp < &p[P_L2_SIZE]) {
        if ((*index & (step - 1)) == 0 && *nb >= step) {
            lp->skip = 0;
            lp->ptr = leaf;
            *index += step;
            *nb -= step;
        } else {
            phys_page_set_level(map, lp, index, nb, leaf, level - 1);
        }
        ++lp;
    }
}